

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O1

size_t FSE_decompress_usingDTable
                 (void *dst,size_t originalSize,void *cSrc,size_t cSrcSize,FSE_DTable *dt)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  FSE_DTable FVar4;
  FSE_DTable FVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 *puVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  bool bVar24;
  ulong *local_50;
  ulong *local_48;
  
  puVar1 = (undefined1 *)((long)dst + (originalSize - 3));
  local_50 = (ulong *)cSrc;
  if (*(short *)((long)dt + 2) == 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xfffffffffffffffd;
      uVar9 = 0;
      iVar12 = 0;
      local_50 = (ulong *)0x0;
      local_48 = (ulong *)0x0;
      puVar22 = (ulong *)0x0;
    }
    else {
      local_48 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar9 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar9 = uVar9 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar9 = uVar9 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar9 = uVar9 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar9 = uVar9 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar9 = uVar9 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar9 = uVar9 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar13 = 0x1f;
          if (bVar7 != 0) {
            for (; bVar7 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          puVar22 = (ulong *)cSrc;
          if (bVar7 == 0) {
            cSrcSize = 0xfffffffffffffffc;
            iVar12 = 0;
          }
          else {
            iVar12 = ~uVar13 + (int)cSrcSize * -8 + 0x49;
          }
        }
      }
      else {
        puVar22 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar9 = *puVar22;
        bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar13 = 0x1f;
        if (bVar7 != 0) {
          for (; bVar7 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        iVar12 = ~uVar13 + 9;
        if (bVar7 == 0) {
          iVar12 = 0;
        }
        cSrcSize = cSrcSize | -(ulong)(bVar7 == 0);
      }
    }
    if (0xfffffffffffffff7 < cSrcSize) {
      return cSrcSize;
    }
    uVar3 = (ushort)*dt;
    bVar7 = 0x3fU - (char)uVar3 & 0x3f;
    uVar18 = ((uVar9 << ((byte)iVar12 & 0x3f)) >> 1) >> bVar7;
    uVar13 = iVar12 + (uint)uVar3;
    iVar12 = (int)local_50;
    if (uVar13 < 0x41) {
      if (puVar22 < local_48) {
        if (puVar22 == local_50) goto LAB_0019c860;
        uVar14 = (int)puVar22 - iVar12;
        if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3))) {
          uVar14 = uVar13 >> 3;
        }
        uVar13 = uVar13 + uVar14 * -8;
      }
      else {
        uVar14 = uVar13 >> 3;
        uVar13 = uVar13 & 7;
      }
      puVar22 = (ulong *)((long)puVar22 - (ulong)uVar14);
      uVar9 = *puVar22;
    }
LAB_0019c860:
    uVar20 = ((uVar9 << ((byte)uVar13 & 0x3f)) >> 1) >> bVar7;
    uVar13 = uVar3 + uVar13;
    if (uVar13 < 0x41) {
      if (puVar22 < local_48) {
        if (puVar22 == local_50) goto LAB_0019c8bb;
        uVar14 = (int)puVar22 - iVar12;
        if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3))) {
          uVar14 = uVar13 >> 3;
        }
        uVar13 = uVar13 + uVar14 * -8;
      }
      else {
        uVar14 = uVar13 >> 3;
        uVar13 = uVar13 & 7;
      }
      puVar22 = (ulong *)((long)puVar22 - (ulong)uVar14);
      uVar9 = *puVar22;
    }
LAB_0019c8bb:
    lVar6 = 0;
    do {
      if (uVar13 < 0x41) {
        if (puVar22 < local_48) {
          if (puVar22 == local_50) goto LAB_0019c8c6;
          bVar24 = local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3));
          uVar14 = (int)puVar22 - iVar12;
          if (bVar24) {
            uVar14 = uVar13 >> 3;
          }
          uVar13 = uVar13 + uVar14 * -8;
        }
        else {
          uVar14 = uVar13 >> 3;
          uVar13 = uVar13 & 7;
          bVar24 = true;
        }
        puVar22 = (ulong *)((long)puVar22 - (ulong)uVar14);
        uVar9 = *puVar22;
      }
      else {
LAB_0019c8c6:
        bVar24 = false;
      }
      puVar16 = (undefined1 *)((long)dst + lVar6);
      if ((puVar1 <= puVar16) || (!bVar24)) goto LAB_0019c9ea;
      bVar7 = *(byte *)((long)dt + uVar18 * 4 + 7);
      uVar23 = ((uVar9 << ((byte)uVar13 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f);
      uVar15 = (ulong)(ushort)dt[uVar18 + 1];
      iVar10 = uVar13 + bVar7;
      *puVar16 = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
      uVar19 = (ulong)(ushort)dt[uVar20 + 1];
      bVar7 = *(byte *)((long)dt + uVar20 * 4 + 7);
      uVar21 = ((uVar9 << ((byte)iVar10 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f);
      iVar10 = iVar10 + (uint)bVar7;
      puVar16[1] = *(undefined1 *)((long)dt + uVar20 * 4 + 6);
      lVar17 = uVar23 * 4;
      bVar7 = *(byte *)((long)dt + uVar15 * 4 + lVar17 + 7);
      uVar18 = (((uVar9 << ((byte)iVar10 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f)) +
               (ulong)(ushort)dt[uVar23 + uVar15 + 1];
      iVar10 = iVar10 + (uint)bVar7;
      puVar16[2] = *(undefined1 *)((long)dt + uVar15 * 4 + lVar17 + 6);
      lVar17 = uVar21 * 4;
      bVar7 = *(byte *)((long)dt + uVar19 * 4 + lVar17 + 7);
      uVar20 = (((uVar9 << ((byte)iVar10 & 0x3f)) >> 1) >> (0x3f - bVar7 & 0x3f)) +
               (ulong)(ushort)dt[uVar21 + uVar19 + 1];
      uVar13 = iVar10 + (uint)bVar7;
      puVar16[3] = *(undefined1 *)((long)dt + uVar19 * 4 + lVar17 + 6);
      lVar6 = lVar6 + 4;
    } while( true );
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xfffffffffffffffd;
    local_48 = (ulong *)0x0;
    local_50 = (ulong *)0x0;
    iVar12 = 0;
    uVar9 = 0;
    puVar22 = (ulong *)0x0;
  }
  else {
    local_48 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar9 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar9 = uVar9 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar9 = uVar9 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar9 = uVar9 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar9 = uVar9 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar9 = uVar9 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar9 = uVar9 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar13 = 0x1f;
        if (bVar7 != 0) {
          for (; bVar7 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        puVar22 = (ulong *)cSrc;
        if (bVar7 == 0) {
          cSrcSize = 0xfffffffffffffffc;
          iVar12 = 0;
        }
        else {
          iVar12 = ~uVar13 + (int)cSrcSize * -8 + 0x49;
        }
      }
    }
    else {
      puVar22 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar9 = *puVar22;
      bVar7 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar13 = 0x1f;
      if (bVar7 != 0) {
        for (; bVar7 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      iVar12 = ~uVar13 + 9;
      if (bVar7 == 0) {
        iVar12 = 0;
      }
      cSrcSize = cSrcSize | -(ulong)(bVar7 == 0);
    }
  }
  if (0xfffffffffffffff7 < cSrcSize) {
    return cSrcSize;
  }
  uVar3 = (ushort)*dt;
  bVar7 = 0x3fU - (char)uVar3 & 0x3f;
  uVar18 = ((uVar9 << ((byte)iVar12 & 0x3f)) >> 1) >> bVar7;
  uVar13 = iVar12 + (uint)uVar3;
  iVar12 = (int)local_50;
  if (uVar13 < 0x41) {
    if (puVar22 < local_48) {
      if (puVar22 == local_50) goto LAB_0019c519;
      uVar14 = (int)puVar22 - iVar12;
      if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3))) {
        uVar14 = uVar13 >> 3;
      }
      uVar13 = uVar13 + uVar14 * -8;
    }
    else {
      uVar14 = uVar13 >> 3;
      uVar13 = uVar13 & 7;
    }
    puVar22 = (ulong *)((long)puVar22 - (ulong)uVar14);
    uVar9 = *puVar22;
  }
LAB_0019c519:
  uVar20 = ((uVar9 << ((byte)uVar13 & 0x3f)) >> 1) >> bVar7;
  uVar13 = uVar3 + uVar13;
  if (uVar13 < 0x41) {
    if (puVar22 < local_48) {
      if (puVar22 == local_50) goto LAB_0019c574;
      uVar14 = (int)puVar22 - iVar12;
      if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3))) {
        uVar14 = uVar13 >> 3;
      }
      uVar13 = uVar13 + uVar14 * -8;
    }
    else {
      uVar14 = uVar13 >> 3;
      uVar13 = uVar13 & 7;
    }
    puVar22 = (ulong *)((long)puVar22 - (ulong)uVar14);
    uVar9 = *puVar22;
  }
LAB_0019c574:
  lVar6 = 0;
  do {
    if (uVar13 < 0x41) {
      if (puVar22 < local_48) {
        if (puVar22 == local_50) goto LAB_0019c584;
        bVar24 = local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3));
        uVar14 = (int)puVar22 - iVar12;
        if (bVar24) {
          uVar14 = uVar13 >> 3;
        }
        uVar13 = uVar13 + uVar14 * -8;
      }
      else {
        uVar14 = uVar13 >> 3;
        uVar13 = uVar13 & 7;
        bVar24 = true;
      }
      puVar22 = (ulong *)((long)puVar22 - (ulong)uVar14);
      uVar9 = *puVar22;
    }
    else {
LAB_0019c584:
      bVar24 = false;
    }
    puVar16 = (undefined1 *)((long)dst + lVar6);
    if ((puVar1 <= puVar16) || (!bVar24)) goto LAB_0019c690;
    bVar7 = *(byte *)((long)dt + uVar18 * 4 + 7);
    iVar10 = uVar13 + bVar7;
    uVar15 = (uVar9 << ((byte)uVar13 & 0x3f)) >> (-bVar7 & 0x3f);
    uVar21 = (ulong)(ushort)dt[uVar18 + 1];
    *puVar16 = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
    bVar7 = *(byte *)((long)dt + uVar20 * 4 + 7);
    iVar11 = iVar10 + (uint)bVar7;
    uVar23 = (uVar9 << ((byte)iVar10 & 0x3f)) >> (-bVar7 & 0x3f);
    uVar19 = (ulong)(ushort)dt[uVar20 + 1];
    puVar16[1] = *(undefined1 *)((long)dt + uVar20 * 4 + 6);
    lVar17 = uVar15 * 4;
    bVar7 = *(byte *)((long)dt + uVar21 * 4 + lVar17 + 7);
    iVar10 = iVar11 + (uint)bVar7;
    uVar18 = ((uVar9 << ((byte)iVar11 & 0x3f)) >> (-bVar7 & 0x3f)) +
             (ulong)(ushort)dt[uVar15 + uVar21 + 1];
    puVar16[2] = *(undefined1 *)((long)dt + uVar21 * 4 + lVar17 + 6);
    lVar17 = uVar23 * 4;
    bVar7 = *(byte *)((long)dt + uVar19 * 4 + lVar17 + 7);
    uVar13 = iVar10 + (uint)bVar7;
    uVar20 = ((uVar9 << ((byte)iVar10 & 0x3f)) >> (-bVar7 & 0x3f)) +
             (ulong)(ushort)dt[uVar23 + uVar19 + 1];
    puVar16[3] = *(undefined1 *)((long)dt + uVar19 * 4 + lVar17 + 6);
    lVar6 = lVar6 + 4;
  } while( true );
LAB_0019c9ea:
  puVar1 = (undefined1 *)((long)dst + (originalSize - 2));
  do {
    lVar17 = lVar6;
    if (puVar1 < (undefined1 *)((long)dst + lVar17)) {
      return 0xfffffffffffffffe;
    }
    FVar4 = dt[uVar18 + 1];
    bVar7 = *(byte *)((long)dt + uVar18 * 4 + 7);
    uVar19 = uVar9 << ((byte)uVar13 & 0x3f);
    uVar13 = uVar13 + bVar7;
    *(undefined1 *)((long)dst + lVar17) = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
    uVar14 = uVar13;
    if (uVar13 < 0x41) {
      if (puVar22 < local_48) {
        if (puVar22 == local_50) goto LAB_0019ca88;
        uVar8 = (int)puVar22 - iVar12;
        if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3))) {
          uVar8 = uVar13 >> 3;
        }
        uVar14 = uVar13 + uVar8 * -8;
      }
      else {
        uVar8 = uVar13 >> 3;
        uVar14 = uVar13 & 7;
      }
      puVar22 = (ulong *)((long)puVar22 - (ulong)uVar8);
      uVar9 = *puVar22;
    }
LAB_0019ca88:
    puVar16 = (undefined1 *)((long)dst + lVar17 + 1);
    if (0x40 < uVar13) goto LAB_0019cb47;
    if (puVar1 < puVar16) {
      return 0xfffffffffffffffe;
    }
    FVar5 = dt[uVar20 + 1];
    bVar2 = *(byte *)((long)dt + uVar20 * 4 + 7);
    uVar15 = uVar9 << ((byte)uVar14 & 0x3f);
    uVar14 = uVar14 + bVar2;
    *puVar16 = *(undefined1 *)((long)dt + uVar20 * 4 + 6);
    uVar13 = uVar14;
    if (uVar14 < 0x41) {
      if (puVar22 < local_48) {
        if (puVar22 == local_50) goto LAB_0019cb23;
        uVar8 = (int)puVar22 - iVar12;
        if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar14 >> 3))) {
          uVar8 = uVar14 >> 3;
        }
        uVar13 = uVar14 + uVar8 * -8;
      }
      else {
        uVar8 = uVar14 >> 3;
        uVar13 = uVar14 & 7;
      }
      puVar22 = (ulong *)((long)puVar22 - (ulong)uVar8);
      uVar9 = *puVar22;
    }
LAB_0019cb23:
    uVar18 = ((uVar19 >> 1) >> (0x3f - bVar7 & 0x3f)) + (ulong)(ushort)FVar4;
    uVar20 = ((uVar15 >> 1) >> (0x3f - bVar2 & 0x3f)) + (ulong)(ushort)FVar5;
    lVar6 = lVar17 + 2;
  } while (uVar14 < 0x41);
  goto LAB_0019cb37;
LAB_0019cb47:
  lVar6 = 2;
  goto LAB_0019cb4c;
LAB_0019c690:
  puVar1 = (undefined1 *)((long)dst + (originalSize - 2));
  do {
    lVar17 = lVar6;
    if (puVar1 < (undefined1 *)((long)dst + lVar17)) {
      return 0xfffffffffffffffe;
    }
    FVar4 = dt[uVar18 + 1];
    bVar7 = *(byte *)((long)dt + uVar18 * 4 + 7);
    uVar19 = uVar9 << ((byte)uVar13 & 0x3f);
    uVar13 = uVar13 + bVar7;
    *(undefined1 *)((long)dst + lVar17) = *(undefined1 *)((long)dt + uVar18 * 4 + 6);
    uVar14 = uVar13;
    if (uVar13 < 0x41) {
      if (puVar22 < local_48) {
        if (puVar22 == local_50) goto LAB_0019c72b;
        uVar8 = (int)puVar22 - iVar12;
        if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar13 >> 3))) {
          uVar8 = uVar13 >> 3;
        }
        uVar14 = uVar13 + uVar8 * -8;
      }
      else {
        uVar8 = uVar13 >> 3;
        uVar14 = uVar13 & 7;
      }
      puVar22 = (ulong *)((long)puVar22 - (ulong)uVar8);
      uVar9 = *puVar22;
    }
LAB_0019c72b:
    puVar16 = (undefined1 *)((long)dst + lVar17 + 1);
    if (0x40 < uVar13) goto LAB_0019cb47;
    if (puVar1 < puVar16) {
      return 0xfffffffffffffffe;
    }
    FVar5 = dt[uVar20 + 1];
    bVar2 = *(byte *)((long)dt + uVar20 * 4 + 7);
    uVar15 = uVar9 << ((byte)uVar14 & 0x3f);
    uVar14 = uVar14 + bVar2;
    *puVar16 = *(undefined1 *)((long)dt + uVar20 * 4 + 6);
    uVar13 = uVar14;
    if (uVar14 < 0x41) {
      if (puVar22 < local_48) {
        if (puVar22 == local_50) goto LAB_0019c7c2;
        uVar8 = (int)puVar22 - iVar12;
        if (local_50 <= (ulong *)((long)puVar22 - (ulong)(uVar14 >> 3))) {
          uVar8 = uVar14 >> 3;
        }
        uVar13 = uVar14 + uVar8 * -8;
      }
      else {
        uVar8 = uVar14 >> 3;
        uVar13 = uVar14 & 7;
      }
      puVar22 = (ulong *)((long)puVar22 - (ulong)uVar8);
      uVar9 = *puVar22;
    }
LAB_0019c7c2:
    uVar18 = (uVar19 >> (-bVar7 & 0x3f)) + (ulong)(ushort)FVar4;
    uVar20 = (uVar15 >> (-bVar2 & 0x3f)) + (ulong)(ushort)FVar5;
    lVar6 = lVar17 + 2;
  } while (uVar14 < 0x41);
LAB_0019cb37:
  puVar16 = (undefined1 *)((long)dst + lVar6);
  lVar6 = 3;
  uVar20 = uVar18;
LAB_0019cb4c:
  *puVar16 = *(undefined1 *)((long)dt + uVar20 * 4 + 6);
  return lVar6 + lVar17;
}

Assistant:

size_t FSE_decompress_usingDTable(void* dst, size_t originalSize,
                            const void* cSrc, size_t cSrcSize,
                            const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* DTableH = (const FSE_DTableHeader*)ptr;
    const U32 fastMode = DTableH->fastMode;

    /* select fast mode (static) */
    if (fastMode) return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 1);
    return FSE_decompress_usingDTable_generic(dst, originalSize, cSrc, cSrcSize, dt, 0);
}